

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Table * sqlite3ResultSetOfSelect(Parse *pParse,Select *pSelect)

{
  sqlite3 *db_00;
  u64 uVar1;
  long lVar2;
  u64 savedFlags;
  sqlite3 *db;
  Table *pTab;
  Select *pSelect_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  uVar1 = db_00->flags;
  db_00->flags = db_00->flags & 0xfffffffffffffffb;
  db_00->flags = db_00->flags | 0x40;
  sqlite3SelectPrep(pParse,pSelect,(NameContext *)0x0);
  db_00->flags = uVar1;
  pTab = (Table *)pSelect;
  if (pParse->nErr == 0) {
    for (; lVar2._0_4_ = pTab->addColOffset, lVar2._4_4_ = pTab->nModuleArg, lVar2 != 0;
        pTab = *(Table **)&pTab->addColOffset) {
    }
    pParse_local = (Parse *)sqlite3DbMallocZero(db_00,0x80);
    if (pParse_local == (Parse *)0x0) {
      pParse_local = (Parse *)0x0;
    }
    else {
      pParse_local->szOpAlloc = 1;
      pParse_local->db = (sqlite3 *)0x0;
      *(LogEst *)&pParse_local->nLabelAlloc = 200;
      sqlite3ColumnsFromExprList
                (pParse,(ExprList *)pTab->zName,(i16 *)((long)&pParse_local->nLabel + 2),
                 (Column **)&pParse_local->zErrMsg);
      sqlite3SelectAddColumnTypeAndCollation(pParse,(Table *)pParse_local,(Select *)pTab);
      *(i16 *)&pParse_local->nLabel = -1;
      if (db_00->mallocFailed != '\0') {
        sqlite3DeleteTable(db_00,(Table *)pParse_local);
        pParse_local = (Parse *)0x0;
      }
    }
  }
  else {
    pParse_local = (Parse *)0x0;
  }
  return (Table *)pParse_local;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3ResultSetOfSelect(Parse *pParse, Select *pSelect){
  Table *pTab;
  sqlite3 *db = pParse->db;
  u64 savedFlags;

  savedFlags = db->flags;
  db->flags &= ~(u64)SQLITE_FullColNames;
  db->flags |= SQLITE_ShortColNames;
  sqlite3SelectPrep(pParse, pSelect, 0);
  db->flags = savedFlags;
  if( pParse->nErr ) return 0;
  while( pSelect->pPrior ) pSelect = pSelect->pPrior;
  pTab = sqlite3DbMallocZero(db, sizeof(Table) );
  if( pTab==0 ){
    return 0;
  }
  pTab->nTabRef = 1;
  pTab->zName = 0;
  pTab->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
  sqlite3ColumnsFromExprList(pParse, pSelect->pEList, &pTab->nCol, &pTab->aCol);
  sqlite3SelectAddColumnTypeAndCollation(pParse, pTab, pSelect);
  pTab->iPKey = -1;
  if( db->mallocFailed ){
    sqlite3DeleteTable(db, pTab);
    return 0;
  }
  return pTab;
}